

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QEventPoint>::emplace<QEventPoint>
          (QMovableArrayOps<QEventPoint> *this,qsizetype i,QEventPoint *args)

{
  QEventPoint **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QEventPoint *pQVar4;
  QEventPointPrivate *pQVar5;
  totally_ordered_wrapper<QEventPointPrivate_*> __old_val;
  long in_FS_OFFSET;
  bool bVar6;
  QEventPoint local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QEventPoint>).super_QArrayDataPointer<QEventPoint>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_002f485a:
    pQVar5 = (args->d).d.ptr;
    (args->d).d.ptr = (QEventPointPrivate *)0x0;
    bVar6 = (this->super_QGenericArrayOps<QEventPoint>).super_QArrayDataPointer<QEventPoint>.size !=
            0;
    QArrayDataPointer<QEventPoint>::detachAndGrow
              ((QArrayDataPointer<QEventPoint> *)this,(uint)(i == 0 && bVar6),1,(QEventPoint **)0x0,
               (QArrayDataPointer<QEventPoint> *)0x0);
    pQVar4 = (this->super_QGenericArrayOps<QEventPoint>).super_QArrayDataPointer<QEventPoint>.ptr;
    if (i == 0 && bVar6) {
      pQVar4[-1].d.d.ptr = pQVar5;
      ppQVar1 = &(this->super_QGenericArrayOps<QEventPoint>).super_QArrayDataPointer<QEventPoint>.
                 ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    else {
      memmove(pQVar4 + i + 1,pQVar4 + i,
              ((this->super_QGenericArrayOps<QEventPoint>).super_QArrayDataPointer<QEventPoint>.size
              - i) * 8);
      pQVar4[i].d.d.ptr = pQVar5;
    }
    local_38.d.d.ptr =
         (QExplicitlySharedDataPointer<QEventPointPrivate>)
         (totally_ordered_wrapper<QEventPointPrivate_*>)0x0;
    pqVar2 = &(this->super_QGenericArrayOps<QEventPoint>).super_QArrayDataPointer<QEventPoint>.size;
    *pqVar2 = *pqVar2 + 1;
    QEventPoint::~QEventPoint(&local_38);
  }
  else {
    if (((this->super_QGenericArrayOps<QEventPoint>).super_QArrayDataPointer<QEventPoint>.size == i)
       && (pQVar4 = (this->super_QGenericArrayOps<QEventPoint>).super_QArrayDataPointer<QEventPoint>
                    .ptr,
          (pDVar3->super_QArrayData).alloc !=
          ((long)((long)pQVar4 -
                 ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3)
          + i)) {
      pQVar5 = (args->d).d.ptr;
      (args->d).d.ptr = (QEventPointPrivate *)0x0;
      pQVar4[i].d.d.ptr = pQVar5;
    }
    else {
      if ((i != 0) ||
         (pQVar4 = (this->super_QGenericArrayOps<QEventPoint>).super_QArrayDataPointer<QEventPoint>.
                   ptr,
         (QEventPoint *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
         == pQVar4)) goto LAB_002f485a;
      pQVar5 = (args->d).d.ptr;
      (args->d).d.ptr = (QEventPointPrivate *)0x0;
      pQVar4[-1].d.d.ptr = pQVar5;
      ppQVar1 = &(this->super_QGenericArrayOps<QEventPoint>).super_QArrayDataPointer<QEventPoint>.
                 ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QEventPoint>).super_QArrayDataPointer<QEventPoint>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }